

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps2raster.cpp
# Opt level: O0

int32 rw::ps2::getRasterFormat(Raster *raster)

{
  FILE *pFVar1;
  uint uVar2;
  int32 iVar3;
  char *pcVar4;
  Error local_ac;
  Error _e_16;
  Error _e_15;
  Error _e_14;
  Error _e_13;
  Error _e_12;
  Error _e_11;
  Error _e_10;
  Error _e_9;
  Error _e_8;
  Error _e_7;
  Error _e_6;
  Error _e_5;
  Error _e_4;
  Error _e_3;
  Error _e_2;
  Error _e_1;
  Error _e;
  int32 mipmapflags;
  int32 pixelformat;
  int32 palformat;
  Raster *raster_local;
  
  _e.code = raster->format & 0xf00;
  mipmapflags = raster->format & 0x6000;
  uVar2 = raster->format & 0x9000;
  switch(raster->type) {
  case 0:
  case 5:
    if ((mipmapflags != 0) || (uVar2 != 0)) {
      _e_7.plugin = 0xb00;
      _e_7.code = 0x8000000a;
      fprintf(_stderr,"%s:%d: ",
              "/workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/ps2/ps2raster.cpp",
              0xa1);
      pFVar1 = _stderr;
      pcVar4 = dbgsprint(0x8000000a);
      fprintf(pFVar1,"%s\n",pcVar4);
      setError(&_e_7);
      return 0;
    }
  case 4:
    if (_e.code == 0) {
      switch(raster->depth) {
      case 4:
        _e.code = 0x100;
        mipmapflags = 0x4000;
        break;
      default:
        _e.code = 0x100;
        mipmapflags = 0;
        break;
      case 8:
        _e.code = 0x100;
        mipmapflags = 0x2000;
        break;
      case 0x18:
      case 0x20:
        _e.code = 0x500;
        mipmapflags = 0;
      }
    }
    raster->format = _e.code | mipmapflags | uVar2;
    if (mipmapflags == 0) {
      if (_e.code == 0x100) {
        if ((raster->depth != 0) && (raster->depth != 0x10)) {
          _e_13.plugin = 0xb00;
          _e_13.code = 0x8000000a;
          fprintf(_stderr,"%s:%d: ",
                  "/workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/ps2/ps2raster.cpp"
                  ,0xdc);
          pFVar1 = _stderr;
          pcVar4 = dbgsprint(0x8000000a);
          fprintf(pFVar1,"%s\n",pcVar4);
          setError(&_e_13);
          return 0;
        }
        raster->depth = 0x10;
      }
      else if (_e.code == 0x500) {
        if ((raster->depth != 0) && (raster->depth != 0x20)) {
          _e_14.plugin = 0xb00;
          _e_14.code = 0x8000000a;
          fprintf(_stderr,"%s:%d: ",
                  "/workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/ps2/ps2raster.cpp"
                  ,0xe2);
          pFVar1 = _stderr;
          pcVar4 = dbgsprint(0x8000000a);
          fprintf(pFVar1,"%s\n",pcVar4);
          setError(&_e_14);
          return 0;
        }
        raster->depth = 0x20;
      }
      else {
        if (_e.code != 0x600) {
          _e_16.plugin = 0xb00;
          _e_16.code = 0x8000000a;
          fprintf(_stderr,"%s:%d: ",
                  "/workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/ps2/ps2raster.cpp"
                  ,0xee);
          pFVar1 = _stderr;
          pcVar4 = dbgsprint(0x8000000a);
          fprintf(pFVar1,"%s\n",pcVar4);
          setError(&_e_16);
          return 0;
        }
        if ((raster->depth != 0) && (raster->depth != 0x18)) {
          _e_15.plugin = 0xb00;
          _e_15.code = 0x8000000a;
          fprintf(_stderr,"%s:%d: ",
                  "/workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/ps2/ps2raster.cpp"
                  ,0xe9);
          pFVar1 = _stderr;
          pcVar4 = dbgsprint(0x8000000a);
          fprintf(pFVar1,"%s\n",pcVar4);
          setError(&_e_15);
          return 0;
        }
        raster->depth = 0x18;
      }
    }
    else if (mipmapflags == 0x2000) {
      if ((raster->depth != 0) && (raster->depth != 8)) {
        _e_8.plugin = 0xb00;
        _e_8.code = 0x8000000a;
        fprintf(_stderr,"%s:%d: ",
                "/workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/ps2/ps2raster.cpp"
                ,0xc4);
        pFVar1 = _stderr;
        pcVar4 = dbgsprint(0x8000000a);
        fprintf(pFVar1,"%s\n",pcVar4);
        setError(&_e_8);
        return 0;
      }
      raster->depth = 8;
      if ((_e.code != 0x100) && (_e.code != 0x500)) {
        _e_9.plugin = 0xb00;
        _e_9.code = 0x8000000a;
        fprintf(_stderr,"%s:%d: ",
                "/workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/ps2/ps2raster.cpp"
                ,0xc9);
        pFVar1 = _stderr;
        pcVar4 = dbgsprint(0x8000000a);
        fprintf(pFVar1,"%s\n",pcVar4);
        setError(&_e_9);
        return 0;
      }
    }
    else {
      if (mipmapflags != 0x4000) {
        _e_12.plugin = 0xb00;
        _e_12.code = 0x8000000a;
        fprintf(_stderr,"%s:%d: ",
                "/workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/ps2/ps2raster.cpp"
                ,0xd7);
        pFVar1 = _stderr;
        pcVar4 = dbgsprint(0x8000000a);
        fprintf(pFVar1,"%s\n",pcVar4);
        setError(&_e_12);
        return 0;
      }
      if ((raster->depth != 0) && (raster->depth != 4)) {
        _e_10.plugin = 0xb00;
        _e_10.code = 0x8000000a;
        fprintf(_stderr,"%s:%d: ",
                "/workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/ps2/ps2raster.cpp"
                ,0xce);
        pFVar1 = _stderr;
        pcVar4 = dbgsprint(0x8000000a);
        fprintf(pFVar1,"%s\n",pcVar4);
        setError(&_e_10);
        return 0;
      }
      raster->depth = 4;
      if ((_e.code != 0x100) && (_e.code != 0x500)) {
        _e_11.plugin = 0xb00;
        _e_11.code = 0x8000000a;
        fprintf(_stderr,"%s:%d: ",
                "/workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/ps2/ps2raster.cpp"
                ,0xd3);
        pFVar1 = _stderr;
        pcVar4 = dbgsprint(0x8000000a);
        fprintf(pFVar1,"%s\n",pcVar4);
        setError(&_e_11);
        return 0;
      }
    }
    break;
  case 1:
    if ((mipmapflags != 0) || (uVar2 != 0)) {
      _e_1.plugin = 0xb00;
      _e_1.code = 0x8000000a;
      fprintf(_stderr,"%s:%d: ",
              "/workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/ps2/ps2raster.cpp",
              0x7b);
      pFVar1 = _stderr;
      pcVar4 = dbgsprint(0x8000000a);
      fprintf(pFVar1,"%s\n",pcVar4);
      setError(&_e_1);
      return 0;
    }
    if ((raster->depth != 0) && (raster->depth != cameraZDepth)) {
      _e_2.plugin = 0xb00;
      _e_2.code = 0x8000000a;
      fprintf(_stderr,"%s:%d: ",
              "/workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/ps2/ps2raster.cpp",
              0x7f);
      pFVar1 = _stderr;
      pcVar4 = dbgsprint(0x8000000a);
      fprintf(pFVar1,"%s\n",pcVar4);
      setError(&_e_2);
      return 0;
    }
    raster->depth = cameraZDepth;
    if ((_e.code != 0) &&
       (((raster->depth == 0x10 && (_e.code != 0x700)) ||
        ((raster->depth == 0x20 && (_e.code != 0x900)))))) {
      _e_3.plugin = 0xb00;
      _e_3.code = 0x8000000a;
      fprintf(_stderr,"%s:%d: ",
              "/workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/ps2/ps2raster.cpp",
              0x86);
      pFVar1 = _stderr;
      pcVar4 = dbgsprint(0x8000000a);
      fprintf(pFVar1,"%s\n",pcVar4);
      setError(&_e_3);
      return 0;
    }
    iVar3 = 0x900;
    if (raster->depth == 0x10) {
      iVar3 = 0x700;
    }
    raster->format = iVar3;
    break;
  case 2:
    if ((mipmapflags != 0) || (uVar2 != 0)) {
      _e_4.plugin = 0xb00;
      _e_4.code = 0x8000000a;
      fprintf(_stderr,"%s:%d: ",
              "/workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/ps2/ps2raster.cpp",
              0x8f);
      pFVar1 = _stderr;
      pcVar4 = dbgsprint(0x8000000a);
      fprintf(pFVar1,"%s\n",pcVar4);
      setError(&_e_4);
      return 0;
    }
    if ((raster->depth != 0) && (raster->depth != cameraDepth)) {
      _e_5.plugin = 0xb00;
      _e_5.code = 0x8000000a;
      fprintf(_stderr,"%s:%d: ",
              "/workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/ps2/ps2raster.cpp",
              0x93);
      pFVar1 = _stderr;
      pcVar4 = dbgsprint(0x8000000a);
      fprintf(pFVar1,"%s\n",pcVar4);
      setError(&_e_5);
      return 0;
    }
    raster->depth = cameraDepth;
    if ((_e.code != 0) && (_e.code != cameraFormat)) {
      _e_6.plugin = 0xb00;
      _e_6.code = 0x8000000a;
      fprintf(_stderr,"%s:%d: ",
              "/workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/ps2/ps2raster.cpp",
              0x98);
      pFVar1 = _stderr;
      pcVar4 = dbgsprint(0x8000000a);
      fprintf(pFVar1,"%s\n",pcVar4);
      setError(&_e_6);
      return 0;
    }
    raster->format = cameraFormat;
    break;
  default:
    local_ac.plugin = 0xb00;
    local_ac.code = 0x8000000a;
    fprintf(_stderr,"%s:%d: ",
            "/workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/ps2/ps2raster.cpp",
            0xf3);
    pFVar1 = _stderr;
    pcVar4 = dbgsprint(0x8000000a);
    fprintf(pFVar1,"%s\n",pcVar4);
    setError(&local_ac);
    return 0;
  }
  return 1;
}

Assistant:

int32
getRasterFormat(Raster *raster)
{
	int32 palformat, pixelformat, mipmapflags;
	pixelformat = raster->format & 0xF00;
	palformat = raster->format & 0x6000;
	mipmapflags = raster->format & 0x9000;
	switch(raster->type){
	case Raster::ZBUFFER:
		if(palformat || mipmapflags){
			RWERROR((ERR_INVRASTER));
			return 0;
		}
		if(raster->depth && raster->depth != cameraZDepth){
			RWERROR((ERR_INVRASTER));
			return 0;
		}
		raster->depth = cameraZDepth;
		if(pixelformat){
			if((raster->depth == 16 && pixelformat != Raster::D16) ||
			   (raster->depth == 32 && pixelformat != Raster::D32)){
				RWERROR((ERR_INVRASTER));
				return 0;
			}
		}
		pixelformat = raster->depth == 16 ? Raster::D16 : Raster::D32;
		raster->format = pixelformat;
		break;
	case Raster::CAMERA:
		if(palformat || mipmapflags){
			RWERROR((ERR_INVRASTER));
			return 0;
		}
		if(raster->depth && raster->depth != cameraDepth){
			RWERROR((ERR_INVRASTER));
			return 0;
		}
		raster->depth = cameraDepth;
		if(pixelformat && pixelformat != cameraFormat){
			RWERROR((ERR_INVRASTER));
			return 0;
		}
		pixelformat = cameraFormat;
		raster->format = pixelformat;
		break;
	case Raster::NORMAL:
	case Raster::CAMERATEXTURE:
		if(palformat || mipmapflags){
			RWERROR((ERR_INVRASTER));
			return 0;
		}
		/* fallthrough */
	case Raster::TEXTURE:
		// Find raster format by depth if none was given
		if(pixelformat == 0)
			switch(raster->depth){
			case 4:
				pixelformat = Raster::C1555;
				palformat = Raster::PAL4;
				break;
			case 8:
				pixelformat = Raster::C1555;
				palformat = Raster::PAL8;
				break;
			case 24:
			// unsafe
			//	pixelformat = Raster::C888;
			//	palformat = 0;
			//	break;
			case 32:
				pixelformat = Raster::C8888;
				palformat = 0;
				break;
			default:
				pixelformat = Raster::C1555;
				palformat = 0;
				break;
			}
		raster->format = pixelformat | palformat | mipmapflags;
		// Sanity check raster format and depth; set depth if none given
		if(palformat){
			if(palformat == Raster::PAL8){
				if(raster->depth && raster->depth != 8){
					RWERROR((ERR_INVRASTER));
					return 0;
				}
				raster->depth = 8;
				if(pixelformat != Raster::C1555 && pixelformat != Raster::C8888){
					RWERROR((ERR_INVRASTER));
					return 0;
				}
			}else if(palformat == Raster::PAL4){
				if(raster->depth && raster->depth != 4){
					RWERROR((ERR_INVRASTER));
					return 0;
				}
				raster->depth = 4;
				if(pixelformat != Raster::C1555 && pixelformat != Raster::C8888){
					RWERROR((ERR_INVRASTER));
					return 0;
				}
			}else{
				RWERROR((ERR_INVRASTER));
				return 0;
			}
		}else if(pixelformat == Raster::C1555){
			if(raster->depth && raster->depth != 16){
				RWERROR((ERR_INVRASTER));
				return 0;
			}
			raster->depth = 16;
		}else if(pixelformat == Raster::C8888){
			if(raster->depth && raster->depth != 32){
				RWERROR((ERR_INVRASTER));
				return 0;
			}
			raster->depth = 32;
		}else if(pixelformat == Raster::C888){
			assert(0 && "24 bit rasters not supported");
			if(raster->depth && raster->depth != 24){
				RWERROR((ERR_INVRASTER));
				return 0;
			}
			raster->depth = 24;
		}else{
			RWERROR((ERR_INVRASTER));
			return 0;
		}
		break;
	default:
		RWERROR((ERR_INVRASTER));
		return 0;
	}
	return 1;
}